

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall miniros::MasterLink::set(MasterLink *this,string *key,RpcValue *v)

{
  Error EVar1;
  string *value;
  XmlRpcValue *pXVar2;
  iterator iVar3;
  mapped_type *this_00;
  mutex *__mutex;
  allocator<char> local_91;
  RpcValue params;
  string local_80;
  RpcValue payload;
  RpcValue result;
  string mapped_key;
  
  if (this->internal_ != (Internal *)0x0) {
    names::resolve(&mapped_key,key,true);
    params._type = TypeInvalid;
    params._value.asDouble = 0.0;
    result._type = TypeInvalid;
    result._value.asDouble = 0.0;
    payload._type = TypeInvalid;
    payload._value.asDouble = 0.0;
    value = this_node::getName_abi_cxx11_();
    XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_80,value);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&params,0);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_80);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&local_80);
    XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_80,&mapped_key);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&params,1);
    XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_80);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&local_80);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&params,2);
    XmlRpc::XmlRpcValue::operator=(pXVar2,v);
    __mutex = &this->internal_->params_mutex;
    std::mutex::lock(__mutex);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"setParam",&local_91);
    EVar1 = execute(this,&local_80,&params,&result,&payload,true);
    std::__cxx11::string::~string((string *)&local_80);
    if (EVar1.code == Ok) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->internal_->subscribed_params)._M_t,&mapped_key);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->internal_->subscribed_params)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                  ::operator[](&this->internal_->params,&mapped_key);
        XmlRpc::XmlRpcValue::operator=(this_00,v);
      }
      invalidateParentParams(this,&mapped_key);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&payload);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&result);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&params);
    std::__cxx11::string::~string((string *)&mapped_key);
  }
  return;
}

Assistant:

void MasterLink::set(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;

  std::string mapped_key = miniros::names::resolve(key);

  RpcValue params, result, payload;
  params[0] = this_node::getName();
  params[1] = mapped_key;
  params[2] = v;

  {
    // Lock around the execute to the master in case we get a parameter update on this value between
    // executing on the master and setting the parameter in the g_params list.
    std::scoped_lock<std::mutex> lock(internal_->params_mutex);

    if (this->execute("setParam", params, result, payload, true)) {
      // Update our cached params list now so that if get() is called immediately after param::set()
      // we already have the cached state and our value will be correct
      if (internal_->subscribed_params.find(mapped_key) != internal_->subscribed_params.end()) {
        internal_->params[mapped_key] = v;
      }
      invalidateParentParams(mapped_key);
    }
  }
}